

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionFromVector3ToVector3(Vector3 from,Vector3 to)

{
  Vector3 VVar1;
  Quaternion QVar2;
  
  VVar1 = Vector3CrossProduct(from,to);
  QVar2.z = VVar1.z;
  QVar2._0_8_ = VVar1._0_8_;
  QVar2.w = from.z * to.z + from.x * to.x + from.y * to.y + 1.0;
  QVar2 = QuaternionNormalize(QVar2);
  return QVar2;
}

Assistant:

RMDEF Quaternion QuaternionFromVector3ToVector3(Vector3 from, Vector3 to)
{
    Quaternion result = { 0 };

    float cos2Theta = Vector3DotProduct(from, to);
    Vector3 cross = Vector3CrossProduct(from, to);

    result.x = cross.x;
    result.y = cross.y;
    result.z = cross.z;
    result.w = 1.0f + cos2Theta;     // NOTE: Added QuaternioIdentity()

    // Normalize to essentially nlerp the original and identity to 0.5
    result = QuaternionNormalize(result);

    // Above lines are equivalent to:
    //Quaternion result = QuaternionNlerp(q, QuaternionIdentity(), 0.5f);

    return result;
}